

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O3

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapPromiseInfo(SnapObject *snpObject,InflateMap *inflator)

{
  uint32 *puVar1;
  JavascriptPromiseReaction *pJVar2;
  IRecyclerVisitedObject IVar3;
  RecyclableObject *pRVar4;
  JavascriptPromiseReaction *pJVar5;
  JavascriptPromiseReaction *pJVar6;
  ulong uVar7;
  IRecyclerVisitedObject this;
  long lVar8;
  JavascriptPromiseReaction *local_78;
  JavascriptPromiseReaction *reaction_1;
  SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> resolveReactions;
  undefined1 local_50 [8];
  SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> rejectReactions;
  
  if (snpObject->SnapObjectTag != SnapPromiseObject) {
    TTDAbort_unrecoverable_error("Tag does not match.");
  }
  puVar1 = (uint32 *)snpObject->AddtlSnapObjectInfo;
  rejectReactions.allocator =
       (Type)InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  if (*(TTDVar *)(puVar1 + 2) == (TTDVar)0x0) {
    resolveReactions.allocator = (Type)0x0;
  }
  else {
    resolveReactions.allocator = (Type)InflateMap::InflateTTDVar(inflator,*(TTDVar *)(puVar1 + 2));
  }
  pJVar6 = (JavascriptPromiseReaction *)&reaction_1;
  resolveReactions.
  super_SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>.
  super_SListNodeBase<Memory::HeapAllocator>.next._0_4_ = 0;
  resolveReactions.
  super_SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>._8_8_ =
       &Memory::HeapAllocator::Instance;
  pJVar2 = pJVar6;
  reaction_1 = pJVar6;
  if (puVar1[4] != 0) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      local_50 = (undefined1  [8])
                 NSSnapValues::InflatePromiseReactionInfo
                           ((SnapPromiseReactionInfo *)(*(long *)(puVar1 + 6) + lVar8),
                            (ScriptContext *)rejectReactions.allocator,inflator);
      SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::Prepend
                ((SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)
                 pJVar6,(HeapAllocator *)
                        resolveReactions.
                        super_SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>
                        ._8_8_,(JavascriptPromiseReaction **)local_50);
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x30;
    } while (uVar7 < puVar1[4]);
    pJVar2 = reaction_1;
    if (reaction_1 != pJVar6) {
      pJVar5 = (JavascriptPromiseReaction *)&reaction_1;
      do {
        pJVar6 = pJVar2;
        pJVar2 = (JavascriptPromiseReaction *)
                 ((SListNodeBase<Memory::HeapAllocator> *)&pJVar6->super_FinalizableObject)->next;
        ((SListNodeBase<Memory::HeapAllocator> *)&pJVar6->super_FinalizableObject)->next =
             (Type)pJVar5;
        pJVar5 = pJVar6;
      } while (pJVar2 != (JavascriptPromiseReaction *)&reaction_1);
    }
  }
  ((SListNodeBase<Memory::HeapAllocator> *)&pJVar2->super_FinalizableObject)->next = (Type)pJVar6;
  this._vptr_IRecyclerVisitedObject = (_func_int **)local_50;
  rejectReactions.super_SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>
  .super_SListNodeBase<Memory::HeapAllocator>.next._0_4_ = 0;
  rejectReactions.super_SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>
  ._8_8_ = &Memory::HeapAllocator::Instance;
  IVar3._vptr_IRecyclerVisitedObject = this._vptr_IRecyclerVisitedObject;
  local_50 = (undefined1  [8])this._vptr_IRecyclerVisitedObject;
  if (puVar1[8] != 0) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      local_78 = NSSnapValues::InflatePromiseReactionInfo
                           ((SnapPromiseReactionInfo *)(*(long *)(puVar1 + 10) + lVar8),
                            (ScriptContext *)rejectReactions.allocator,inflator);
      SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::Prepend
                ((SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)
                 this._vptr_IRecyclerVisitedObject,
                 (HeapAllocator *)
                 rejectReactions.
                 super_SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>.
                 _8_8_,&local_78);
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x30;
    } while (uVar7 < puVar1[8]);
    IVar3._vptr_IRecyclerVisitedObject = (_func_int **)local_50;
    if (local_50 != (undefined1  [8])this._vptr_IRecyclerVisitedObject) {
      pJVar6 = (JavascriptPromiseReaction *)local_50;
      do {
        this._vptr_IRecyclerVisitedObject = IVar3._vptr_IRecyclerVisitedObject;
        IVar3._vptr_IRecyclerVisitedObject =
             (_func_int **)
             ((SListNodeBase<Memory::HeapAllocator> *)
             &((JavascriptPromiseReaction *)this._vptr_IRecyclerVisitedObject)->
              super_FinalizableObject)->next;
        ((SListNodeBase<Memory::HeapAllocator> *)
        &((JavascriptPromiseReaction *)this._vptr_IRecyclerVisitedObject)->super_FinalizableObject)
        ->next = (Type)pJVar6;
        pJVar6 = (JavascriptPromiseReaction *)this._vptr_IRecyclerVisitedObject;
      } while ((JavascriptPromiseReaction *)IVar3._vptr_IRecyclerVisitedObject !=
               (JavascriptPromiseReaction *)local_50);
    }
  }
  ((SListNodeBase<Memory::HeapAllocator> *)
  &((JavascriptPromiseReaction *)IVar3._vptr_IRecyclerVisitedObject)->super_FinalizableObject)->next
       = (Type)this._vptr_IRecyclerVisitedObject;
  pRVar4 = Js::JavascriptLibrary::CreatePromise_TTD
                     ((JavascriptLibrary *)((rejectReactions.allocator)->data).head,*puVar1,
                      SUB41(puVar1[1],0),resolveReactions.allocator,
                      (SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)
                      &reaction_1,
                      (SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)
                      local_50);
  SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::~SList
            ((SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)local_50);
  SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::~SList
            ((SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)&reaction_1
            );
  return pRVar4;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapPromiseInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            const SnapPromiseInfo* promiseInfo = SnapObjectGetAddtlInfoAs<SnapPromiseInfo*, SnapObjectType::SnapPromiseObject>(snpObject);
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);

            Js::Var result = (promiseInfo->Result != nullptr) ? inflator->InflateTTDVar(promiseInfo->Result) : nullptr;

            SList<Js::JavascriptPromiseReaction*, HeapAllocator> resolveReactions(&HeapAllocator::Instance);
            for(uint32 i = 0; i < promiseInfo->ResolveReactionCount; ++i)
            {
                Js::JavascriptPromiseReaction* reaction = NSSnapValues::InflatePromiseReactionInfo(promiseInfo->ResolveReactions + i, ctx, inflator);
                resolveReactions.Prepend(reaction);
            }
            resolveReactions.Reverse();

            SList<Js::JavascriptPromiseReaction*, HeapAllocator> rejectReactions(&HeapAllocator::Instance);
            for(uint32 i = 0; i < promiseInfo->RejectReactionCount; ++i)
            {
                Js::JavascriptPromiseReaction* reaction = NSSnapValues::InflatePromiseReactionInfo(promiseInfo->RejectReactions + i, ctx, inflator);
                rejectReactions.Prepend(reaction);
            }
            rejectReactions.Reverse();

            Js::RecyclableObject* res = ctx->GetLibrary()->CreatePromise_TTD(promiseInfo->Status, promiseInfo->isHandled, result, resolveReactions, rejectReactions);

            return res;
        }